

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O0

dynlink dynlink_load(dynlink_path path,dynlink_name name,dynlink_flags flags)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  char *__dest;
  dynlink_impl pvVar4;
  dynlink_flags in_EDX;
  char *in_RSI;
  char *in_RDI;
  size_t join_path_size;
  dynlink_name_impl join_path;
  dynlink_name_impl name_impl;
  dynlink handle;
  dynlink in_stack_ffffffffffffdfb0;
  char *in_stack_ffffffffffffdfb8;
  dynlink_name in_stack_ffffffffffffdfc0;
  undefined1 local_2028 [4096];
  undefined1 local_1028 [4108];
  dynlink_flags local_1c;
  char *local_18;
  char *local_10;
  
  if ((in_RSI != (char *)0x0) &&
     (local_1c = in_EDX, local_18 = in_RSI, local_10 = in_RDI, local_1028._4096_8_ = malloc(0x2010),
     (dynlink)local_1028._4096_8_ != (dynlink)0x0)) {
    strncpy((char *)local_1028._4096_8_,local_18,0xfff);
    dynlink_get_name((dynlink)local_1028._4096_8_);
    dynlink_impl_get_name
              (in_stack_ffffffffffffdfc0,in_stack_ffffffffffffdfb8,(size_t)in_stack_ffffffffffffdfb0
              );
    if (local_10 == (char *)0x0) {
      __dest = (char *)(local_1028._4096_8_ + 0x1000);
      in_stack_ffffffffffffdfb0 = (dynlink)local_1028;
      sVar1 = strnlen(local_1028,0x1000);
      strncpy(__dest,in_stack_ffffffffffffdfb0->name,sVar1 + 1);
    }
    else {
      sVar1 = strnlen(local_10,0x1000);
      lVar2 = sVar1 + 1;
      sVar1 = strnlen(local_1028,0x1000);
      uVar3 = portability_path_join(local_10,lVar2,local_1028,sVar1 + 1,local_2028,0x1000);
      portability_path_canonical(local_2028,uVar3,(char *)(local_1028._4096_8_ + 0x1000),0x1000);
    }
    *(dynlink_flags *)(local_1028._4096_8_ + 0x2000) = local_1c;
    pvVar4 = dynlink_impl_load(in_stack_ffffffffffffdfb0);
    *(dynlink_impl *)(local_1028._4096_8_ + 0x2008) = pvVar4;
    if (*(dynlink_impl *)(local_1028._4096_8_ + 0x2008) != (dynlink_impl)0x0) {
      return (dynlink)local_1028._4096_8_;
    }
    free((void *)local_1028._4096_8_);
  }
  return (dynlink)0x0;
}

Assistant:

dynlink dynlink_load(dynlink_path path, dynlink_name name, dynlink_flags flags)
{
	if (name != NULL)
	{
		dynlink handle = malloc(sizeof(struct dynlink_type));

		if (handle != NULL)
		{
			dynlink_name_impl name_impl;

			strncpy(handle->name, name, PORTABILITY_PATH_SIZE - 1);

			dynlink_impl_get_name(dynlink_get_name(handle), name_impl, PORTABILITY_PATH_SIZE);

			if (path != NULL)
			{
				dynlink_name_impl join_path;

				size_t join_path_size = portability_path_join(path, strnlen(path, PORTABILITY_PATH_SIZE) + 1, name_impl, strnlen(name_impl, PORTABILITY_PATH_SIZE) + 1, join_path, PORTABILITY_PATH_SIZE);

				(void)portability_path_canonical(join_path, join_path_size, handle->name_impl, PORTABILITY_PATH_SIZE);
			}
			else
			{
				strncpy(handle->name_impl, name_impl, strnlen(name_impl, PORTABILITY_PATH_SIZE) + 1);
			}

			handle->flags = flags;

			handle->impl = dynlink_impl_load(handle);

			if (handle->impl != NULL)
			{
				return handle;
			}

			free(handle);
		}
	}

	return NULL;
}